

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O2

bool read_control_data(string *filename,vector<control_s,_std::allocator<control_s>_> *position_meas
                      )

{
  uint uVar1;
  istream *piVar2;
  double yawrate;
  double velocity;
  control_s meas;
  string line_pos;
  ifstream in_file_pos;
  uint auStack_398 [122];
  istringstream iss_pos;
  
  std::ifstream::ifstream(&in_file_pos,(filename->_M_dataplus)._M_p,_S_in);
  uVar1 = *(uint *)((long)auStack_398 + *(long *)(_in_file_pos + -0x18));
  if ((uVar1 & 5) == 0) {
    line_pos._M_dataplus._M_p = (pointer)&line_pos.field_2;
    line_pos._M_string_length = 0;
    line_pos.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&in_file_pos,(string *)&line_pos);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&iss_pos,(string *)&line_pos,_S_in);
      std::istream::_M_extract<double>((double *)&iss_pos);
      std::istream::_M_extract<double>((double *)&iss_pos);
      std::vector<control_s,_std::allocator<control_s>_>::push_back(position_meas,&meas);
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss_pos);
    }
    std::__cxx11::string::~string((string *)&line_pos);
  }
  std::ifstream::~ifstream(&in_file_pos);
  return (uVar1 & 5) == 0;
}

Assistant:

inline bool read_control_data(std::string filename, std::vector<control_s>& position_meas) {

	// Get file of position measurements:
	std::ifstream in_file_pos(filename.c_str(),std::ifstream::in);
	// Return if we can't open the file.
	if (!in_file_pos) {
		return false;
	}

	// Declare single line of position measurement file:
	std::string line_pos;

	// Run over each single line:
	while(getline(in_file_pos, line_pos)){

		std::istringstream iss_pos(line_pos);

		// Declare position values:
		double velocity, yawrate;

		// Declare single control measurement:
		control_s meas;

		//read data from line to values:

		iss_pos >> velocity;
		iss_pos >> yawrate;

		
		// Set values
		meas.velocity = velocity;
		meas.yawrate = yawrate;

		// Add to list of control measurements:
		position_meas.push_back(meas);
	}
	return true;
}